

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::recoverdelaunay(tetgenmesh *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  ulong uVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  tetrahedron *pppdVar10;
  arraypool *paVar11;
  arraypool *this_00;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  tetgenmesh *this_01;
  badface **fstack;
  long lVar17;
  triface *ptVar18;
  arraypool *this_02;
  long *plVar19;
  tetgenbehavior *ptVar20;
  byte bVar21;
  flipconstraints fc;
  triface local_c0;
  badface **local_b0;
  flipconstraints local_a8;
  
  bVar21 = 0;
  local_c0.ver = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8.tetprism_vol_sum._4_4_ = 0;
  local_a8.remove_large_angle = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 0;
  if (this->b->quiet == 0) {
    puts("Recovering Delaunayness...");
  }
  this->tetprism_vol_sum = 0.0;
  pmVar4 = this->tetrahedrons;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  this_01 = this;
  pppdVar10 = tetrahedrontraverse(this);
  local_c0.tet = pppdVar10;
  if (pppdVar10 != (tetrahedron *)0x0) {
    do {
      local_c0.ver = 0;
      lVar17 = 0;
      local_c0.tet = pppdVar10;
      do {
        if ((*(uint *)(((ulong)pppdVar10[lVar17] & 0xfffffffffffffff0) +
                      (long)this->elemmarkerindex * 4) >> ((byte)pppdVar10[lVar17] & 3) & 4) == 0) {
          this_01 = this;
          flippush(this,&this->flipstack,&local_c0);
        }
        lVar17 = lVar17 + 1;
        local_c0.ver = (int)lVar17;
      } while (lVar17 != 4);
      dVar7 = tetprismvol(this_01,(double *)pppdVar10[4],(double *)pppdVar10[5],
                          (double *)pppdVar10[6],(double *)pppdVar10[7]);
      this->tetprism_vol_sum = dVar7 + this->tetprism_vol_sum;
      this_01 = this;
      pppdVar10 = tetrahedrontraverse(this);
      local_c0.tet = pppdVar10;
    } while (pppdVar10 != (tetrahedron *)0x0);
  }
  local_a8.bak_tetprism_vol = this->b->epsilon * this->tetprism_vol_sum * 0.001;
  if (this->b->verbose != 0) {
    printf("  Initial obj = %.17g\n");
    if (1 < this->b->verbose) {
      printf("    Recover Delaunay [Lawson] : %ld\n",this->flippool->items);
    }
  }
  local_a8.remove_ndelaunay_edge = 1;
  local_a8.enqflag = 2;
  lawsonflip3d(this,&local_a8);
  if (1 < this->b->verbose) {
    printf("    obj (after Lawson) = %.17g\n",SUB84(this->tetprism_vol_sum,0));
  }
  this_02 = this->unflipqueue;
  if (this_02->objects == 0) {
    return;
  }
  plVar19 = &this_02->objects;
  local_a8.unflip = 1;
  local_a8.collectnewtets = 1;
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  this->autofliplinklevel = 1;
  ptVar20 = this->b;
  ptVar20->fliplinklevel = -1;
  iVar1 = ptVar20->flipstarsize;
  ptVar20->flipstarsize = 10;
  paVar11 = (arraypool *)operator_new(0x30);
  paVar11->objectbytes = 0x88;
  paVar11->objectsperblock = 0x400;
  paVar11->log2objectsperblock = 10;
  paVar11->objectsperblockmark = 0x3ff;
  paVar11->toparraylen = 0;
  paVar11->toparray = (char **)0x0;
  paVar11->objects = 0;
  paVar11->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x88;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  this->unflipqueue = paVar11;
  if (0 < *plVar19) {
    fstack = &this->flipstack;
    paVar11 = this_00;
    this_00 = this_02;
    local_b0 = fstack;
    do {
      this_02 = paVar11;
      if (this->b->verbose < 2) {
LAB_00145fc9:
        lVar17 = 0;
        do {
          pcVar16 = this_00->toparray[(uint)lVar17 >> ((byte)this_00->log2objectsperblock & 0x1f)];
          lVar15 = (long)this_00->objectbytes *
                   (long)(int)(this_00->objectsperblockmark & (uint)lVar17);
          ptVar18 = (triface *)(pcVar16 + lVar15);
          iVar8 = getedge(this,*(point *)(pcVar16 + lVar15 + 0x58),
                          *(point *)(pcVar16 + lVar15 + 0x60),ptVar18);
          if (iVar8 != 0) {
            iVar8 = removeedgebyflips(this,ptVar18,&local_a8);
            if (iVar8 == 2) {
              this->tetprism_vol_sum =
                   (double)CONCAT44(local_a8.tetprism_vol_sum._4_4_,local_a8.tetprism_vol_sum._0_4_)
                   + this->tetprism_vol_sum;
              local_a8.tetprism_vol_sum._0_4_ = 0;
              local_a8.tetprism_vol_sum._4_4_ = 0;
              paVar11 = this->cavetetlist;
              if (0 < paVar11->objects) {
                lVar15 = 0;
                do {
                  lVar13 = (long)paVar11->objectbytes *
                           (long)(int)(paVar11->objectsperblockmark & (uint)lVar15);
                  lVar14 = *(long *)(paVar11->toparray
                                     [(uint)lVar15 >> ((byte)paVar11->log2objectsperblock & 0x1f)] +
                                    lVar13);
                  if ((lVar14 != 0) && (*(long *)(lVar14 + 0x20) != 0)) {
                    ptVar18 = (triface *)
                              (paVar11->toparray
                               [(uint)lVar15 >> ((byte)paVar11->log2objectsperblock & 0x1f)] +
                              lVar13);
                    ptVar18->ver = 0;
                    iVar8 = 0;
                    do {
                      iVar9 = iVar8;
                      if ((*(uint *)(((ulong)ptVar18->tet[iVar8] & 0xfffffffffffffff0) +
                                    (long)this->elemmarkerindex * 4) >>
                           ((byte)ptVar18->tet[iVar8] & 3) & 4) == 0) {
                        flippush(this,fstack,ptVar18);
                        iVar9 = ptVar18->ver;
                      }
                      iVar8 = iVar9 + 1;
                      ptVar18->ver = iVar8;
                    } while (iVar9 < 3);
                    paVar11 = this->cavetetlist;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < paVar11->objects);
              }
              paVar11->objects = 0;
              local_a8.enqflag = 2;
              lawsonflip3d(this,&local_a8);
              local_a8._0_8_ = (ulong)(uint)local_a8.chkencflag << 0x20;
              paVar11 = this->unflipqueue;
              if (0 < paVar11->objects) {
                lVar15 = 0;
                do {
                  pcVar16 = paVar11->toparray
                            [(uint)lVar15 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
                  uVar2 = paVar11->objectsperblockmark;
                  iVar8 = paVar11->objectbytes;
                  pcVar12 = arraypool::getblock(this_00,(int)*plVar19);
                  iVar9 = this_00->objectsperblock;
                  uVar6 = *plVar19;
                  iVar3 = this_00->objectbytes;
                  *plVar19 = uVar6 + 1;
                  pcVar16 = pcVar16 + (long)iVar8 * (long)(int)(uVar2 & (uint)lVar15) + 0x20;
                  pcVar12 = pcVar12 + (long)iVar3 * ((long)iVar9 - 1U & uVar6);
                  *(undefined8 *)pcVar12 = *(undefined8 *)(pcVar16 + -0x20);
                  *(undefined4 *)(pcVar12 + 8) = *(undefined4 *)(pcVar16 + -0x18);
                  *(undefined8 *)(pcVar12 + 0x10) = *(undefined8 *)(pcVar16 + -0x10);
                  *(undefined4 *)(pcVar12 + 0x18) = *(undefined4 *)(pcVar16 + -8);
                  pcVar12 = pcVar12 + 0x20;
                  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
                    *(undefined8 *)pcVar12 = *(undefined8 *)pcVar16;
                    pcVar16 = pcVar16 + (ulong)bVar21 * -0x10 + 8;
                    pcVar12 = pcVar12 + (ulong)bVar21 * -0x10 + 8;
                  }
                  lVar15 = lVar15 + 1;
                  paVar11 = this->unflipqueue;
                } while (lVar15 < paVar11->objects);
              }
              paVar11->objects = 0;
              fstack = local_b0;
            }
            else {
              pcVar16 = arraypool::getblock(this_02,(int)this_02->objects);
              uVar6 = this_02->objects;
              this_02->objects = uVar6 + 1;
              pcVar16 = pcVar16 + (long)this_02->objectbytes *
                                  ((long)this_02->objectsperblock - 1U & uVar6);
              *(tetrahedron **)pcVar16 = ptVar18->tet;
              *(int *)(pcVar16 + 8) = ptVar18->ver;
              *(tetrahedron **)(pcVar16 + 0x10) = ptVar18[1].tet;
              *(int *)(pcVar16 + 0x18) = ptVar18[1].ver;
              ptVar18 = ptVar18 + 2;
              pcVar16 = pcVar16 + 0x20;
              for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
                *(tetrahedron **)pcVar16 = ptVar18->tet;
                ptVar18 = (triface *)&ptVar18[-(ulong)bVar21].ver;
                pcVar16 = pcVar16 + (ulong)bVar21 * -0x10 + 8;
              }
              local_a8.tetprism_vol_sum._0_4_ = 0;
              local_a8.tetprism_vol_sum._4_4_ = 0;
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < *plVar19);
      }
      else {
        printf("    Recover Delaunay [level = %2d] #:  %ld.\n");
        if (0 < *plVar19) goto LAB_00145fc9;
      }
      if (1 < this->b->verbose) {
        printf("    obj (after level %d) = %.17g.\n",SUB84(this->tetprism_vol_sum,0));
      }
      *plVar19 = 0;
      if (this_02->objects < 1) {
        ptVar20 = this->b;
        break;
      }
      ptVar20 = this->b;
      if (ptVar20->delmaxfliplevel <= this->autofliplinklevel) goto LAB_001462d4;
      plVar19 = &this_02->objects;
      this->autofliplinklevel = this->autofliplinklevel + ptVar20->fliplinklevelinc;
      paVar11 = this_00;
      this_00 = this_02;
    } while( true );
  }
LAB_001462fc:
  if (ptVar20->verbose != 0) {
    printf("  Final obj  = %.17g\n",SUB84(this->tetprism_vol_sum,0));
    ptVar20 = this->b;
  }
  ptVar20->flipstarsize = iVar1;
  arraypool::~arraypool(this_02);
  operator_delete(this_02,0x30);
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  return;
LAB_001462d4:
  if (1 < ptVar20->verbose) {
    printf("    %ld non-Delaunay edges remained.\n",this_02->objects);
    ptVar20 = this->b;
  }
  goto LAB_001462fc;
}

Assistant:

void tetgenmesh::recoverdelaunay()
{
  arraypool *flipqueue, *nextflipqueue, *swapqueue;
  triface tetloop, neightet, *parytet;
  badface *bface, *parybface;
  point *ppt;
  flipconstraints fc;
  int i, j;

  if (!b->quiet) {
    printf("Recovering Delaunayness...\n");
  }

  tetprism_vol_sum = 0.0; // Initialize it.

  // Put all interior faces of the mesh into 'flipstack'.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      decode(tetloop.tet[tetloop.ver], neightet);
      if (!facemarked(neightet)) {
        flippush(flipstack, &tetloop);
      }
    }
    ppt = (point *) &(tetloop.tet[4]);
    tetprism_vol_sum += tetprismvol(ppt[0], ppt[1], ppt[2], ppt[3]);
    tetloop.tet = tetrahedrontraverse();
  }

  // Calulate a relatively lower bound for small improvement. 
  //   Used to avoid rounding error in volume calculation.
  fc.bak_tetprism_vol = tetprism_vol_sum * b->epsilon * 1e-3;

  if (b->verbose) {
    printf("  Initial obj = %.17g\n", tetprism_vol_sum);
  }

  if (b->verbose > 1) {
    printf("    Recover Delaunay [Lawson] : %ld\n", flippool->items);
  }

  // First only use the basic Lawson's flip.
  fc.remove_ndelaunay_edge = 1;
  fc.enqflag = 2;

  lawsonflip3d(&fc);

  if (b->verbose > 1) {
    printf("    obj (after Lawson) = %.17g\n", tetprism_vol_sum);
  }

  if (unflipqueue->objects == 0l) {
    return; // The mesh is Delaunay.
  }

  fc.unflip = 1; // Unflip if the edge is not flipped.
  fc.collectnewtets = 1; // new tets are returned in 'cavetetlist'.
  fc.enqflag = 0;

  autofliplinklevel = 1; // Init level.
  b->fliplinklevel = -1; // No fixed level.

  // For efficiency reason, we limit the maximium size of the edge star.
  int bakmaxflipstarsize = b->flipstarsize;
  b->flipstarsize = 10; // default

  flipqueue = new arraypool(sizeof(badface), 10);
  nextflipqueue = new arraypool(sizeof(badface), 10);
  
  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  while (flipqueue->objects > 0l) {

    if (b->verbose > 1) {
      printf("    Recover Delaunay [level = %2d] #:  %ld.\n",
             autofliplinklevel, flipqueue->objects);
    }

    for (i = 0; i < flipqueue->objects; i++) {
      bface  = (badface *) fastlookup(flipqueue, i);
      if (getedge(bface->forg, bface->fdest, &bface->tt)) {
        if (removeedgebyflips(&(bface->tt), &fc) == 2) {
          tetprism_vol_sum += fc.tetprism_vol_sum;
          fc.tetprism_vol_sum = 0.0; // Clear it.
          // Queue new faces for flips.
          for (j = 0; j < cavetetlist->objects; j++) {
            parytet = (triface *) fastlookup(cavetetlist, j);
            // A queued new tet may be dead.
            if (!isdeadtet(*parytet)) {
              for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
                // Avoid queue a face twice.
                decode(parytet->tet[parytet->ver], neightet);
                if (!facemarked(neightet)) {
                  flippush(flipstack, parytet);
                }
              } // parytet->ver
            }
          } // j
          cavetetlist->restart();
          // Remove locally non-Delaunay faces. New non-Delaunay edges
          //   may be found. They are saved in 'unflipqueue'.
          fc.enqflag = 2;
          lawsonflip3d(&fc);
          fc.enqflag = 0;
          // There may be unflipable faces. Add them in flipqueue.
          for (j = 0; j < unflipqueue->objects; j++) {
            bface  = (badface *) fastlookup(unflipqueue, j);
            flipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          }
          unflipqueue->restart();
        } else {
          // Unable to remove this edge. Save it.
          nextflipqueue->newindex((void **) &parybface);
          *parybface = *bface;
          // Normally, it should be zero. 
          //assert(fc.tetprism_vol_sum == 0.0);
          // However, due to rounding errors, a tiny value may appear.
          fc.tetprism_vol_sum = 0.0;
        }
      }
    } // i

    if (b->verbose > 1) {
      printf("    obj (after level %d) = %.17g.\n", autofliplinklevel,
             tetprism_vol_sum);
    }
    flipqueue->restart();

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = nextflipqueue;
    nextflipqueue = swapqueue;

    if (flipqueue->objects > 0l) {
      // default 'b->delmaxfliplevel' is 1.
      if (autofliplinklevel >= b->delmaxfliplevel) {
        // For efficiency reason, we do not search too far.
        break;
      }
      autofliplinklevel+=b->fliplinklevelinc;
    }
  } // while (flipqueue->objects > 0l)

  if (flipqueue->objects > 0l) {
    if (b->verbose > 1) {
      printf("    %ld non-Delaunay edges remained.\n", flipqueue->objects);
    }
  }

  if (b->verbose) {
    printf("  Final obj  = %.17g\n", tetprism_vol_sum);
  }

  b->flipstarsize = bakmaxflipstarsize;
  delete flipqueue;
  delete nextflipqueue;
}